

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_dirty(_glist *x,t_floatarg f)

{
  uint uVar1;
  _glist *in_RAX;
  _glist *x_00;
  uint uVar2;
  
  x_00 = canvas_getrootfor(in_RAX);
  if ((pd_maininstance.pd_gui)->i_reloadingabstraction == (_glist *)0x0) {
    uVar1 = *(uint *)&x_00->field_0xe8;
    uVar2 = (uint)(long)f;
    if ((uVar2 != ((uVar1 >> 2 & 1) != 0)) &&
       (*(ushort *)&x_00->field_0xe8 = ((ushort)uVar1 & 0xfffb) + ((ushort)(long)f & 1) * 4,
       (uVar1 & 1) != 0)) {
      canvas_reflecttitle(x_00);
    }
    if (uVar2 == 0) {
      canvas_undo_cleardirty(x);
      return;
    }
  }
  return;
}

Assistant:

void canvas_dirty(t_canvas *x, t_floatarg f)
{
    t_canvas *x2 = canvas_getrootfor(x);
    unsigned int n = f;
    if (THISGUI->i_reloadingabstraction)
        return;
    if (n != x2->gl_dirty)
    {
        x2->gl_dirty = n;
        if (x2->gl_havewindow)
            canvas_reflecttitle(x2);
    }
    if(!n)
        canvas_undo_cleardirty(x);
}